

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O0

void __thiscall
htmlcxx2::HTML::ParserSax::parseTag<char_const*>(ParserSax *this,char *begin,char *pos)

{
  undefined8 __end;
  int iVar1;
  long lVar2;
  char *s1;
  size_t length;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  allocator<char> local_181;
  string local_180;
  undefined1 local_160 [8];
  Node node;
  undefined1 local_a8 [8];
  string text;
  size_t i;
  size_t tagLen;
  size_t arrCount;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string name;
  char *name_end;
  char *pcStack_28;
  bool isClosingTag;
  char *name_begin;
  char *pos_local;
  char *begin_local;
  ParserSax *this_local;
  
  pcStack_28 = begin + 1;
  bVar4 = *pcStack_28 == '/';
  if (bVar4) {
    pcStack_28 = begin + 2;
  }
  name.field_2._8_8_ = pcStack_28;
  while( true ) {
    bVar5 = false;
    if ((char *)name.field_2._8_8_ != pos) {
      iVar1 = isalnum((uint)*(byte *)name.field_2._8_8_);
      bVar5 = iVar1 != 0;
    }
    __end = name.field_2._8_8_;
    if (!bVar5) break;
    name.field_2._8_8_ = name.field_2._8_8_ + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>
            ((string *)local_58,pcStack_28,(char *)__end,&local_59);
  std::allocator<char>::~allocator(&local_59);
  if (!bVar4) {
    lVar2 = std::__cxx11::string::length();
    for (text.field_2._8_8_ = 0; (ulong)text.field_2._8_8_ < 5;
        text.field_2._8_8_ = text.field_2._8_8_ + 1) {
      if (lVar2 == (char)(&impl::LITERAL_MODE_ELEM)[text.field_2._8_8_ * 0xb]) {
        s1 = (char *)std::__cxx11::string::c_str();
        iVar1 = impl::icompare<char>(s1,"script" + text.field_2._8_8_ * 0xb);
        if (iVar1 == 0) {
          this->literal_ = "script" + text.field_2._8_8_ * 0xb;
          break;
        }
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>
            ((string *)local_a8,begin,pos,(allocator<char> *)&node.field_0xaf);
  std::allocator<char>::~allocator((allocator<char> *)&node.field_0xaf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"",&local_181);
  sVar3 = this->currentOffset_;
  length = std::__cxx11::string::length();
  Node::Node((Node *)local_160,(string *)local_58,(string *)local_a8,&local_180,sVar3,length,
             NODE_TAG);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  sVar3 = Node::length((Node *)local_160);
  this->currentOffset_ = this->currentOffset_ + sVar3;
  (*this->_vptr_ParserSax[3])(this,(Node *)local_160,(ulong)bVar4);
  Node::~Node((Node *)local_160);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void ParserSax::parseTag(It begin, It pos)
{
    It name_begin(begin);
    ++name_begin;
    bool isClosingTag = (*name_begin == '/');
    if (isClosingTag)
        ++name_begin;
    It name_end(name_begin);
    while ((name_end != pos) && ::isalnum((unsigned char)*name_end))
        ++name_end;
    std::string name(name_begin, name_end);

    if (!isClosingTag)
    {
        const size_t arrCount = sizeof(impl::LITERAL_MODE_ELEM) /
                sizeof(impl::LITERAL_MODE_ELEM[0]);
        const size_t tagLen = name.length();
        for (size_t i = 0; i < arrCount; ++i)
            if ((tagLen == static_cast<size_t>(impl::LITERAL_MODE_ELEM[i][0]))
                    && (impl::icompare(name.c_str(), &impl::LITERAL_MODE_ELEM[i][1]) == 0))
                {
                    literal_ = &impl::LITERAL_MODE_ELEM[i][1];
                    break;
                }
    }

    //by now, length is just the size of the tag
    std::string text(begin, pos);
    Node node(name, text, "", currentOffset_, text.length(), Node::NODE_TAG);
    currentOffset_ += node.length();
    onFoundTag(node, isClosingTag);
}